

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffcrhd(fitsfile *fptr,int *status)

{
  LONGLONG bytepos_00;
  int iVar1;
  void *pvVar2;
  LONGLONG *ptr;
  LONGLONG bytepos;
  int *piStack_20;
  int tstatus;
  int *status_local;
  fitsfile *fptr_local;
  
  bytepos._4_4_ = 0;
  if (*status < 1) {
    piStack_20 = status;
    status_local = &fptr->HDUposition;
    if (fptr->HDUposition != fptr->Fptr->curhdu) {
      ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
    }
    if (*(long *)(*(long *)(status_local + 2) + 0x70) ==
        *(long *)(*(long *)(*(long *)(status_local + 2) + 0x68) +
                 (long)*(int *)(*(long *)(status_local + 2) + 0x54) * 8)) {
      fptr_local._4_4_ = *piStack_20;
    }
    else {
      do {
        iVar1 = ffmrhd((fitsfile *)status_local,1,(int *)0x0,(int *)((long)&bytepos + 4));
      } while (iVar1 == 0);
      if (*(int *)(*(long *)(status_local + 2) + 0x60) ==
          *(int *)(*(long *)(status_local + 2) + 100)) {
        pvVar2 = realloc(*(void **)(*(long *)(status_local + 2) + 0x68),
                         (long)(*(int *)(*(long *)(status_local + 2) + 100) + 0x3e9) << 3);
        if (pvVar2 == (void *)0x0) {
          *piStack_20 = 0x71;
          return 0x71;
        }
        *(int *)(*(long *)(status_local + 2) + 100) =
             *(int *)(*(long *)(status_local + 2) + 100) + 1000;
        *(void **)(*(long *)(status_local + 2) + 0x68) = pvVar2;
      }
      iVar1 = ffchdu((fitsfile *)status_local,piStack_20);
      if (iVar1 < 1) {
        bytepos_00 = *(LONGLONG *)
                      (*(long *)(*(long *)(status_local + 2) + 0x68) +
                      (long)(*(int *)(*(long *)(status_local + 2) + 0x60) + 1) * 8);
        ffmbyt((fitsfile *)status_local,bytepos_00,1,piStack_20);
        *(int *)(*(long *)(status_local + 2) + 0x60) =
             *(int *)(*(long *)(status_local + 2) + 0x60) + 1;
        *(undefined4 *)(*(long *)(status_local + 2) + 0x54) =
             *(undefined4 *)(*(long *)(status_local + 2) + 0x60);
        *status_local = *(int *)(*(long *)(status_local + 2) + 0x60);
        *(LONGLONG *)(*(long *)(status_local + 2) + 0x80) = bytepos_00;
        *(LONGLONG *)(*(long *)(status_local + 2) + 0x70) = bytepos_00;
        *(undefined8 *)(*(long *)(status_local + 2) + 0x88) = 0xffffffffffffffff;
        *(undefined4 *)(*(long *)(status_local + 2) + 0x478) =
             *(undefined4 *)(*(long *)(status_local + 2) + 0x428);
      }
      fptr_local._4_4_ = *piStack_20;
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffcrhd(fitsfile *fptr,      /* I - FITS file pointer */
           int *status)         /* IO - error status     */
/*
  CReate Header Data unit:  Create, initialize, and move the i/o pointer
  to a new extension appended to the end of the FITS file.
*/
{
    int  tstatus = 0;
    LONGLONG bytepos, *ptr;

    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    /* If the current header is empty, we don't have to do anything */
    if ((fptr->Fptr)->headend == (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu] )
        return(*status);

    while (ffmrhd(fptr, 1, 0, &tstatus) == 0);  /* move to end of file */

    if ((fptr->Fptr)->maxhdu == (fptr->Fptr)->MAXHDU)
    {
        /* allocate more space for the headstart array */
        ptr = (LONGLONG*) realloc( (fptr->Fptr)->headstart,
                        ((fptr->Fptr)->MAXHDU + 1001) * sizeof(LONGLONG) );

        if (ptr == NULL)
           return (*status = MEMORY_ALLOCATION);
        else {
          (fptr->Fptr)->MAXHDU = (fptr->Fptr)->MAXHDU + 1000;
          (fptr->Fptr)->headstart = ptr;
        }
    }

    if (ffchdu(fptr, status) <= 0)  /* close the current HDU */
    {
      bytepos = (fptr->Fptr)->headstart[(fptr->Fptr)->maxhdu + 1]; /* last */
      ffmbyt(fptr, bytepos, IGNORE_EOF, status);  /* move file ptr to it */
      (fptr->Fptr)->maxhdu++;       /* increment the known number of HDUs */
      (fptr->Fptr)->curhdu = (fptr->Fptr)->maxhdu; /* set current HDU loc */
      fptr->HDUposition    = (fptr->Fptr)->maxhdu; /* set current HDU loc */
      (fptr->Fptr)->nextkey = bytepos;    /* next keyword = start of header */
      (fptr->Fptr)->headend = bytepos;          /* end of header */
      (fptr->Fptr)->datastart = DATA_UNDEFINED; /* start data unit undefined */

       /* any other needed resets */
       
       /* reset the dithering offset that may have been calculated for the */
       /* previous HDU back to the requested default value */
       (fptr->Fptr)->dither_seed = (fptr->Fptr)->request_dither_seed;
    }

    return(*status);
}